

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

shared_ptr<mocker::ast::Expression> __thiscall
mocker::Parser::prefixUnary(Parser *this,TokIter *iter,TokIter end)

{
  Token *this_00;
  bool bVar1;
  TokenID TVar2;
  pointer pTVar3;
  SyntaxError *this_01;
  ASTNode *this_02;
  mapped_type *pmVar4;
  shared_ptr<mocker::ast::Expression> *args_1;
  TokIter in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::ast::Expression> sVar5;
  Position beg;
  Position end_00;
  NodeID local_140;
  size_t local_138;
  OpType *pOStack_130;
  Token *local_128;
  size_t sStack_120;
  undefined1 local_110 [24];
  undefined1 local_f8 [8];
  reverse_iterator riter;
  Position local_e0;
  undefined4 local_cc;
  undefined1 local_c0 [8];
  shared_ptr<mocker::ast::Expression> res;
  OpType local_a8 [6];
  Token *local_90;
  byte local_81;
  undefined1 local_80 [7];
  bool flag;
  vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_> prefix;
  GetTokenID local_60;
  GetTokenID id;
  size_t local_50;
  undefined1 auStack_38 [8];
  Position begPos;
  TokIter *iter_local;
  Parser *this_local;
  TokIter end_local;
  
  begPos.col = (size_t)end._M_current;
  pTVar3 = __gnu_cxx::
           __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
           ::operator->((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                         *)end._M_current);
  Token::position((pair<mocker::Position,_mocker::Position> *)&id,pTVar3);
  auStack_38 = (undefined1  [8])id.end._M_current;
  begPos.line = local_50;
  GetTokenID::GetTokenID(&local_60,in_RCX);
  std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>::
  vector((vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_> *)
         local_80);
  local_81 = 1;
  while ((local_81 & 1) != 0) {
    local_90 = (Token *)__gnu_cxx::
                        __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                        ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                                      *)begPos.col,0);
    TVar2 = GetTokenID::operator()(&local_60,(TokIter)local_90);
    switch(TVar2) {
    case Plus:
      break;
    case Minus:
      local_a8[0] = Neg;
      std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>::
      emplace_back<mocker::ast::UnaryExpr::OpType>
                ((vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                  *)local_80,local_a8);
      break;
    default:
      __gnu_cxx::
      __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
      ::operator--((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                    *)begPos.col);
      local_81 = 0;
      break;
    case LogicalNot:
      res.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ = 5;
      std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>::
      emplace_back<mocker::ast::UnaryExpr::OpType>
                ((vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                  *)local_80,
                 (OpType *)
                 ((long)&res.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 4));
      break;
    case BitNot:
      res.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ = 6;
      std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>::
      emplace_back<mocker::ast::UnaryExpr::OpType>
                ((vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                  *)local_80,
                 (OpType *)
                 &res.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      break;
    case PlusPlus:
      local_a8[2] = 0;
      std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>::
      emplace_back<mocker::ast::UnaryExpr::OpType>
                ((vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                  *)local_80,local_a8 + 2);
      break;
    case MinusMinus:
      local_a8[1] = 2;
      std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>::
      emplace_back<mocker::ast::UnaryExpr::OpType>
                ((vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                  *)local_80,local_a8 + 1);
    }
  }
  suffixIncDec((Parser *)local_c0,iter,(TokIter)begPos.col);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_c0);
  if (bVar1) {
    std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>::
    rbegin((vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
            *)local_f8);
    while( true ) {
      std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>::
      rend((vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
            *)(local_110 + 0x10));
      bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<mocker::ast::UnaryExpr::OpType_*,_std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>_>_>
                               *)local_f8,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<mocker::ast::UnaryExpr::OpType_*,_std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>_>_>
                               *)(local_110 + 0x10));
      if (!bVar1) break;
      local_128 = (Token *)auStack_38;
      sStack_120 = begPos.line;
      this_00 = iter[2]._M_current;
      this_02 = &std::
                 __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_c0)->super_ASTNode;
      local_140 = ast::ASTNode::getID(this_02);
      pmVar4 = std::
               unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
               ::operator[]((unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                             *)this_00,&local_140);
      local_138 = (pmVar4->second).line;
      pOStack_130 = (OpType *)(pmVar4->second).col;
      args_1 = (shared_ptr<mocker::ast::Expression> *)
               std::
               reverse_iterator<__gnu_cxx::__normal_iterator<mocker::ast::UnaryExpr::OpType_*,_std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<mocker::ast::UnaryExpr::OpType_*,_std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>_>_>
                            *)local_f8);
      beg.col = (size_t)local_128;
      beg.line = (size_t)iter;
      end_00.col = local_138;
      end_00.line = sStack_120;
      makeNode<mocker::ast::UnaryExpr,mocker::ast::UnaryExpr::OpType&,std::shared_ptr<mocker::ast::Expression>&>
                ((Parser *)local_110,beg,end_00,pOStack_130,args_1);
      std::shared_ptr<mocker::ast::Expression>::operator=
                ((shared_ptr<mocker::ast::Expression> *)local_c0,
                 (shared_ptr<mocker::ast::UnaryExpr> *)local_110);
      std::shared_ptr<mocker::ast::UnaryExpr>::~shared_ptr
                ((shared_ptr<mocker::ast::UnaryExpr> *)local_110);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<mocker::ast::UnaryExpr::OpType_*,_std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<mocker::ast::UnaryExpr::OpType_*,_std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>_>_>
                    *)local_f8);
    }
    std::shared_ptr<mocker::ast::Expression>::shared_ptr
              ((shared_ptr<mocker::ast::Expression> *)this,
               (shared_ptr<mocker::ast::Expression> *)local_c0);
  }
  else {
    bVar1 = std::
            vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
            ::empty((vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>
                     *)local_80);
    if (!bVar1) {
      this_01 = (SyntaxError *)__cxa_allocate_exception(0x48);
      pTVar3 = __gnu_cxx::
               __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
               ::operator->((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                             *)begPos.col);
      Token::position((pair<mocker::Position,_mocker::Position> *)&riter,pTVar3);
      SyntaxError::SyntaxError(this_01,(Position *)auStack_38,&local_e0);
      __cxa_throw(this_01,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
    }
    std::shared_ptr<mocker::ast::Expression>::shared_ptr
              ((shared_ptr<mocker::ast::Expression> *)this,(nullptr_t)0x0);
  }
  local_cc = 1;
  std::shared_ptr<mocker::ast::Expression>::~shared_ptr
            ((shared_ptr<mocker::ast::Expression> *)local_c0);
  std::vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_>::
  ~vector((vector<mocker::ast::UnaryExpr::OpType,_std::allocator<mocker::ast::UnaryExpr::OpType>_> *
          )local_80);
  sVar5.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::Expression>)
         sVar5.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::Expression> Parser::prefixUnary(TokIter &iter,
                                                     TokIter end) {
  // ++, --, +, -, !, ~
  // prefix '+' will be ignored
  auto begPos = iter->position().first;
  auto id = GetTokenID(end);

  std::vector<ast::UnaryExpr::OpType> prefix;
  bool flag = true;
  while (flag) {
    switch (id(iter++)) {
    case TokenID::PlusPlus:
      prefix.emplace_back(ast::UnaryExpr::PreInc);
      break;
    case TokenID::MinusMinus:
      prefix.emplace_back(ast::UnaryExpr::PreDec);
      break;
    case TokenID::Plus:
      break;
    case TokenID::Minus:
      prefix.emplace_back(ast::UnaryExpr::Neg);
      break;
    case TokenID::LogicalNot:
      prefix.emplace_back(ast::UnaryExpr::LogicalNot);
      break;
    case TokenID::BitNot:
      prefix.emplace_back(ast::UnaryExpr::BitNot);
      break;
    default:
      --iter;
      flag = false;
      break;
    }
  }

  auto res = suffixIncDec(iter, end);
  if (!res) {
    if (prefix.empty())
      return nullptr;
    throw SyntaxError(begPos, iter->position().second);
  }

  for (auto riter = prefix.rbegin(); riter != prefix.rend(); ++riter)
    res =
        makeNode<ast::UnaryExpr>(begPos, pos[res->getID()].second, *riter, res);

  return res;
}